

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_andnot.c
# Opt level: O3

_Bool run_bitset_container_andnot
                (run_container_t *src_1,bitset_container_t *src_2,container_t **dst)

{
  ushort uVar1;
  ushort uVar2;
  rle16_t *prVar3;
  int iVar4;
  array_container_t *paVar5;
  bitset_container_t *bitset;
  byte bVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  int run_value;
  int iVar13;
  uint64_t *puVar14;
  uint uVar15;
  
  iVar4 = run_container_cardinality(src_1);
  if (iVar4 < 0x1001) {
    paVar5 = array_container_create_given_capacity(iVar4);
    paVar5->cardinality = 0;
    iVar4 = src_1->n_runs;
    if (0 < (long)iVar4) {
      prVar3 = src_1->runs;
      puVar14 = src_2->words;
      iVar12 = 0;
      lVar11 = 0;
      do {
        uVar10 = (ulong)prVar3[lVar11].value;
        iVar13 = prVar3[lVar11].length + 1;
        do {
          if ((*(ulong *)((long)puVar14 + (ulong)((uint)(uVar10 >> 3) & 0x1ff8)) >> (uVar10 & 0x3f)
              & 1) == 0) {
            lVar8 = (long)iVar12;
            iVar12 = iVar12 + 1;
            paVar5->cardinality = iVar12;
            paVar5->array[lVar8] = (uint16_t)uVar10;
          }
          uVar10 = (ulong)((int)uVar10 + 1);
          iVar13 = iVar13 + -1;
        } while (iVar13 != 0);
        lVar11 = lVar11 + 1;
      } while (lVar11 != iVar4);
    }
    *dst = paVar5;
    return false;
  }
  bitset = bitset_container_clone(src_2);
  iVar4 = src_1->n_runs;
  if ((long)iVar4 < 1) {
    puVar14 = bitset->words;
    *puVar14 = 0;
    uVar15 = 0;
    uVar7 = 0;
LAB_0011c58c:
    memset((void *)((long)puVar14 + (ulong)(uVar15 >> 3 & 0x1ff8) + 8),0,
           (ulong)(uVar7 * -8 + 0x1fe8) + 8);
    uVar10 = 0xffffffffffffffff;
  }
  else {
    prVar3 = src_1->runs;
    puVar14 = bitset->words;
    lVar11 = 0;
    uVar15 = 0;
    do {
      uVar1 = prVar3[lVar11].value;
      uVar2 = prVar3[lVar11].length;
      bVar6 = (byte)uVar1;
      if (uVar15 != uVar1) {
        uVar7 = uVar15 >> 6;
        uVar10 = -1L << ((byte)uVar15 & 0x3f);
        uVar15 = uVar1 - 1 >> 6;
        if (uVar15 - uVar7 == 0) {
          uVar10 = (uVar10 << (-bVar6 & 0x3f)) >> (-bVar6 & 0x3f);
          uVar15 = uVar7;
        }
        else {
          puVar14[uVar7] = puVar14[uVar7] & ~uVar10;
          if (uVar7 + 1 < uVar15) {
            memset(puVar14 + (ulong)uVar7 + 1,0,(ulong)((uVar15 - uVar7) - 2) * 8 + 8);
          }
          uVar10 = 0xffffffffffffffff >> (-bVar6 & 0x3f);
        }
        puVar14[uVar15] = puVar14[uVar15] & ~uVar10;
      }
      uVar9 = (uint)uVar2 + (uint)uVar1;
      uVar15 = (uint)uVar2 + (uint)uVar1 + 1;
      if (uVar15 != uVar1) {
        uVar10 = (ulong)(uint)(uVar1 >> 6);
        uVar7 = uVar9 >> 6;
        puVar14[uVar10] = ~(-1L << (bVar6 & 0x3f) ^ puVar14[uVar10]);
        if (uVar1 >> 6 < uVar7) {
          do {
            puVar14[uVar10] = ~puVar14[uVar10];
            uVar10 = uVar10 + 1;
          } while (uVar7 != uVar10);
        }
        puVar14[uVar7] = puVar14[uVar7] ^ 0xffffffffffffffffU >> (~(byte)uVar9 & 0x3f);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != iVar4);
    if (uVar15 == 0x10000) goto LAB_0011c5c3;
    uVar7 = uVar15 >> 6;
    uVar10 = -1L << ((byte)uVar15 & 0x3f);
    if ((uVar7 != 0x3ff) &&
       (puVar14[uVar7] = puVar14[uVar7] & ~uVar10, uVar10 = 0xffffffffffffffff, uVar9 < 0xff7f))
    goto LAB_0011c58c;
  }
  puVar14[0x3ff] = puVar14[0x3ff] & ~uVar10;
LAB_0011c5c3:
  iVar4 = bitset_container_compute_cardinality(bitset);
  bitset->cardinality = iVar4;
  if (iVar4 < 0x1001) {
    paVar5 = array_container_from_bitset(bitset);
    *dst = paVar5;
    bitset_container_free(bitset);
    return false;
  }
  *dst = bitset;
  return true;
}

Assistant:

bool run_bitset_container_andnot(const run_container_t *src_1,
                                 const bitset_container_t *src_2,
                                 container_t **dst) {
    // follows the Java implementation as of June 2016
    int card = run_container_cardinality(src_1);
    if (card <= DEFAULT_MAX_SIZE) {
        // must be an array
        array_container_t *answer = array_container_create_given_capacity(card);
        answer->cardinality = 0;
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            rle16_t rle = src_1->runs[rlepos];
            for (int run_value = rle.value; run_value <= rle.value + rle.length;
                 ++run_value) {
                if (!bitset_container_get(src_2, (uint16_t)run_value)) {
                    answer->array[answer->cardinality++] = (uint16_t)run_value;
                }
            }
        }
        *dst = answer;
        return false;
    } else {  // we guess it will be a bitset, though have to check guess when
              // done
        bitset_container_t *answer = bitset_container_clone(src_2);

        uint32_t last_pos = 0;
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            rle16_t rle = src_1->runs[rlepos];

            uint32_t start = rle.value;
            uint32_t end = start + rle.length + 1;
            bitset_reset_range(answer->words, last_pos, start);
            bitset_flip_range(answer->words, start, end);
            last_pos = end;
        }
        bitset_reset_range(answer->words, last_pos, (uint32_t)(1 << 16));

        answer->cardinality = bitset_container_compute_cardinality(answer);

        if (answer->cardinality <= DEFAULT_MAX_SIZE) {
            *dst = array_container_from_bitset(answer);
            bitset_container_free(answer);
            return false;  // not bitset
        }
        *dst = answer;
        return true;  // bitset
    }
}